

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

void __thiscall
QGraphicsView::ensureVisible(QGraphicsView *this,QRectF *rect,int xmargin,int ymargin)

{
  int iVar1;
  int iVar2;
  QGraphicsViewPrivate *pQVar3;
  qint64 qVar4;
  qint64 qVar5;
  QScrollBar *pQVar6;
  int in_ECX;
  int in_EDX;
  long in_FS_OFFSET;
  qreal qVar7;
  qreal bottom;
  qreal top;
  qreal right;
  qreal left;
  qreal height;
  qreal width;
  QGraphicsViewPrivate *d;
  QRectF viewRect;
  QGraphicsViewPrivate *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff70;
  int value;
  QScrollBar *in_stack_ffffffffffffff78;
  QRectF local_28;
  long local_8;
  
  value = (int)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QGraphicsView *)0xa397ad);
  QAbstractScrollArea::viewport((QAbstractScrollArea *)in_stack_ffffffffffffff60);
  iVar1 = QWidget::width((QWidget *)0xa397c4);
  QAbstractScrollArea::viewport((QAbstractScrollArea *)in_stack_ffffffffffffff60);
  iVar2 = QWidget::height((QWidget *)0xa397e0);
  local_28.xp = -NAN;
  local_28.yp = -NAN;
  local_28.w = -NAN;
  local_28.h = -NAN;
  QTransform::mapRect((QRectF *)&local_28);
  qVar4 = QGraphicsViewPrivate::horizontalScroll(in_stack_ffffffffffffff60);
  qVar5 = QGraphicsViewPrivate::verticalScroll(in_stack_ffffffffffffff60);
  qVar7 = QRectF::left(&local_28);
  if (((qVar7 <= (double)qVar4 + (double)in_EDX) && (pQVar3->leftIndent == 0.0)) &&
     (!NAN(pQVar3->leftIndent))) {
    in_stack_ffffffffffffff78 =
         QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)in_stack_ffffffffffffff60);
    QRectF::left(&local_28);
    QAbstractSlider::setValue(&in_stack_ffffffffffffff78->super_QAbstractSlider,value);
  }
  qVar7 = QRectF::right(&local_28);
  if (((((double)qVar4 + (double)iVar1) - (double)in_EDX <= qVar7) && (pQVar3->leftIndent == 0.0))
     && (!NAN(pQVar3->leftIndent))) {
    pQVar6 = QAbstractScrollArea::horizontalScrollBar
                       ((QAbstractScrollArea *)in_stack_ffffffffffffff60);
    value = (int)((ulong)pQVar6 >> 0x20);
    QRectF::right(&local_28);
    QAbstractSlider::setValue(&in_stack_ffffffffffffff78->super_QAbstractSlider,value);
  }
  qVar7 = QRectF::top(&local_28);
  if (((qVar7 <= (double)qVar5 + (double)in_ECX) && (pQVar3->topIndent == 0.0)) &&
     (!NAN(pQVar3->topIndent))) {
    QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)in_stack_ffffffffffffff60);
    QRectF::top(&local_28);
    QAbstractSlider::setValue(&in_stack_ffffffffffffff78->super_QAbstractSlider,value);
  }
  qVar7 = QRectF::bottom(&local_28);
  if (((((double)qVar5 + (double)iVar2) - (double)in_ECX <= qVar7) && (pQVar3->topIndent == 0.0)) &&
     (!NAN(pQVar3->topIndent))) {
    QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)in_stack_ffffffffffffff60);
    QRectF::bottom(&local_28);
    QAbstractSlider::setValue(&in_stack_ffffffffffffff78->super_QAbstractSlider,value);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsView::ensureVisible(const QRectF &rect, int xmargin, int ymargin)
{
    Q_D(QGraphicsView);
    qreal width = viewport()->width();
    qreal height = viewport()->height();
    QRectF viewRect = d->matrix.mapRect(rect);

    qreal left = d->horizontalScroll();
    qreal right = left + width;
    qreal top = d->verticalScroll();
    qreal bottom = top + height;

    if (viewRect.left() <= left + xmargin) {
        // need to scroll from the left
        if (!d->leftIndent)
            horizontalScrollBar()->setValue(int(viewRect.left() - xmargin - 0.5));
    }
    if (viewRect.right() >= right - xmargin) {
        // need to scroll from the right
        if (!d->leftIndent)
            horizontalScrollBar()->setValue(int(viewRect.right() - width + xmargin + 0.5));
    }
    if (viewRect.top() <= top + ymargin) {
        // need to scroll from the top
        if (!d->topIndent)
            verticalScrollBar()->setValue(int(viewRect.top() - ymargin - 0.5));
    }
    if (viewRect.bottom() >= bottom - ymargin) {
        // need to scroll from the bottom
        if (!d->topIndent)
            verticalScrollBar()->setValue(int(viewRect.bottom() - height + ymargin + 0.5));
    }
}